

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result wabt::ReadBinaryIr(char *filename,void *data,size_t size,ReadBinaryOptions *options,
                         Errors *errors,Module *out_module)

{
  Result RVar1;
  _Map_pointer ppEVar2;
  BinaryReaderIR local_d8;
  
  local_d8.super_BinaryReaderNop.super_BinaryReaderDelegate.state = (State *)0x0;
  local_d8.super_BinaryReaderNop.super_BinaryReaderDelegate._vptr_BinaryReaderDelegate =
       (_func_int **)&PTR__BinaryReaderIR_001a0798;
  local_d8.current_func_ = (Func *)0x0;
  local_d8.label_stack_.
  super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.label_stack_.
  super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.label_stack_.
  super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.code_metadata_queue_.entries.
  super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 8;
  local_d8.errors_ = errors;
  local_d8.module_ = out_module;
  local_d8.filename_ = filename;
  ppEVar2 = (_Map_pointer)operator_new(0x40);
  local_d8.code_metadata_queue_.entries.
  super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
  ._M_impl.super__Deque_impl_data._M_map = ppEVar2;
  local_d8.code_metadata_queue_.entries.
  super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)operator_new(0x1b8);
  ppEVar2[3] = local_d8.code_metadata_queue_.entries.
               super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_d8.code_metadata_queue_.entries.
  super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last =
       local_d8.code_metadata_queue_.entries.
       super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
       ._M_impl.super__Deque_impl_data._M_start._M_cur + 5;
  local_d8.current_metadata_name_._M_len = 0;
  local_d8.current_metadata_name_._M_str = (char *)0x0;
  local_d8.code_metadata_queue_.entries.
  super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first =
       local_d8.code_metadata_queue_.entries.
       super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
       ._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_d8.code_metadata_queue_.entries.
  super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = ppEVar2 + 3;
  local_d8.code_metadata_queue_.entries.
  super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur =
       local_d8.code_metadata_queue_.entries.
       super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
       ._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_d8.code_metadata_queue_.entries.
  super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first =
       local_d8.code_metadata_queue_.entries.
       super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
       ._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_d8.code_metadata_queue_.entries.
  super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last =
       local_d8.code_metadata_queue_.entries.
       super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
       ._M_impl.super__Deque_impl_data._M_start._M_last;
  local_d8.code_metadata_queue_.entries.
  super__Deque_base<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry,_std::allocator<wabt::(anonymous_namespace)::CodeMetadataExprQueue::Entry>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = ppEVar2 + 3;
  RVar1 = ReadBinary(data,size,(BinaryReaderDelegate *)&local_d8,options);
  anon_unknown_15::BinaryReaderIR::~BinaryReaderIR(&local_d8);
  return (Result)RVar1.enum_;
}

Assistant:

Result ReadBinaryIr(const char* filename,
                    const void* data,
                    size_t size,
                    const ReadBinaryOptions& options,
                    Errors* errors,
                    Module* out_module) {
  BinaryReaderIR reader(out_module, filename, errors);
  return ReadBinary(data, size, &reader, options);
}